

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialModule.cpp
# Opt level: O0

tensor __thiscall module::SequentialModule::predict(SequentialModule *this,tensor in)

{
  size_type sVar1;
  reference ppLVar2;
  tensor ppplVar3;
  int local_28;
  int local_24;
  int itLayer;
  int z;
  int y;
  int x;
  tensor in_local;
  SequentialModule *this_local;
  
  for (z = 0; z < this->_sizeXIn; z = z + 1) {
    for (itLayer = 0; itLayer < this->_sizeYIn; itLayer = itLayer + 1) {
      for (local_24 = 0; local_24 < this->_sizeZIn; local_24 = local_24 + 1) {
        this->_in[local_24][itLayer][z] = in[local_24][itLayer][z];
      }
    }
  }
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<layer::Layer_*,_std::allocator<layer::Layer_*>_>::size(&this->_lLayers);
    if (sVar1 <= (ulong)(long)local_28) break;
    ppLVar2 = std::vector<layer::Layer_*,_std::allocator<layer::Layer_*>_>::operator[]
                        (&this->_lLayers,(long)local_28);
    (*(*ppLVar2)->_vptr_Layer[3])();
    local_28 = local_28 + 1;
  }
  ppLVar2 = std::vector<layer::Layer_*,_std::allocator<layer::Layer_*>_>::back(&this->_lLayers);
  ppplVar3 = layer::Layer::getPtrOut(*ppLVar2);
  return ppplVar3;
}

Assistant:

type::tensor SequentialModule::predict(type::tensor in)
    {
        for(int x(0); x < _sizeXIn; x++)
            for(int y(0); y < _sizeYIn; y++)
                for(int z(0); z < _sizeZIn; z++)
                    _in[z][y][x] = in[z][y][x];

        for(int itLayer(0); itLayer < _lLayers.size(); itLayer++)
            _lLayers[itLayer]->predict();
        return _lLayers.back()->getPtrOut();
    }